

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall
wallet::CWallet::AddScriptPubKeyMan
          (CWallet *this,uint256 *id,
          unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
          spkm_man)

{
  long lVar1;
  ScriptPubKeyMan *pSVar2;
  int iVar3;
  mapped_type *pmVar4;
  undefined4 extraout_var;
  ScriptPubKeyMan *pSVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pmVar4 = std::
           map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           ::operator[](&this->m_spk_managers,id);
  pSVar5 = *(ScriptPubKeyMan **)
            spkm_man._M_t.
            super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
            .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  *(undefined8 *)
   spkm_man._M_t.
   super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>.
   _M_t.
   super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>.
   super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl = 0;
  pSVar2 = (pmVar4->_M_t).
           super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
           .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  (pmVar4->_M_t).
  super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>._M_t
  .super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>.
  super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl = pSVar5;
  if (pSVar2 != (ScriptPubKeyMan *)0x0) {
    (*pSVar2->_vptr_ScriptPubKeyMan[1])(pSVar2);
    pSVar5 = (pmVar4->_M_t).
             super___uniq_ptr_impl<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::ScriptPubKeyMan_*,_std::default_delete<wallet::ScriptPubKeyMan>_>
             .super__Head_base<0UL,_wallet::ScriptPubKeyMan_*,_false>._M_head_impl;
  }
  iVar3 = (*pSVar5->_vptr_ScriptPubKeyMan[0x13])();
  if (CONCAT44(extraout_var,iVar3) < (this->m_birth_time).super___atomic_base<long>._M_i) {
    LOCK();
    (this->m_birth_time).super___atomic_base<long>._M_i = CONCAT44(extraout_var,iVar3);
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddScriptPubKeyMan(const uint256& id, std::unique_ptr<ScriptPubKeyMan> spkm_man)
{
    // Add spkm_man to m_spk_managers before calling any method
    // that might access it.
    const auto& spkm = m_spk_managers[id] = std::move(spkm_man);

    // Update birth time if needed
    MaybeUpdateBirthTime(spkm->GetTimeFirstKey());
}